

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::Own<kj::NetworkAddress>_>::~ExceptionOr
          (ExceptionOr<kj::Own<kj::NetworkAddress>_> *this)

{
  ExceptionOr<kj::Own<kj::NetworkAddress>_> *this_local;
  
  Maybe<kj::Own<kj::NetworkAddress>_>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}